

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

void __thiscall DisasmReplayer::DisasmReplayer(DisasmReplayer *this,VulkanDevice *device_)

{
  PFN_vkCreatePipelineCache p_Var1;
  VkDevice pVVar2;
  undefined1 local_40 [8];
  VkPipelineCacheCreateInfo info;
  VulkanDevice *device__local;
  DisasmReplayer *this_local;
  
  info.pInitialData = device_;
  Fossilize::StateCreatorInterface::StateCreatorInterface(&this->super_StateCreatorInterface);
  (this->super_StateCreatorInterface)._vptr_StateCreatorInterface =
       (_func_int **)&PTR__DisasmReplayer_0080c570;
  this->device = (VulkanDevice *)info.pInitialData;
  std::vector<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>::vector
            (&this->sampler_infos);
  std::
  vector<const_VkDescriptorSetLayoutCreateInfo_*,_std::allocator<const_VkDescriptorSetLayoutCreateInfo_*>_>
  ::vector(&this->set_layout_infos);
  std::
  vector<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>::
  vector(&this->pipeline_layout_infos);
  std::vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>::
  vector(&this->shader_module_infos);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::vector(&this->render_pass_infos);
  std::
  vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
  ::vector(&this->graphics_infos);
  std::
  vector<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
  ::vector(&this->compute_infos);
  std::
  vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
  ::vector(&this->raytracing_infos);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->graphics_hashes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->compute_hashes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->raytracing_hashes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->module_hashes);
  std::
  unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
  ::unordered_map(&this->module_to_index);
  std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::vector(&this->samplers);
  std::vector<VkDescriptorSetLayout_T_*,_std::allocator<VkDescriptorSetLayout_T_*>_>::vector
            (&this->layouts);
  std::vector<VkPipelineLayout_T_*,_std::allocator<VkPipelineLayout_T_*>_>::vector
            (&this->pipeline_layouts);
  std::vector<VkShaderModule_T_*,_std::allocator<VkShaderModule_T_*>_>::vector
            (&this->shader_modules);
  std::vector<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>::vector(&this->render_passes);
  std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::vector(&this->compute_pipelines);
  std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::vector(&this->graphics_pipelines);
  std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::vector(&this->raytracing_pipelines);
  this->pipeline_cache = (VkPipelineCache)0x0;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->filter_graphics);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->filter_compute);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->filter_raytracing);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->filter_modules);
  if (this->device != (VulkanDevice *)0x0) {
    memset(local_40,0,0x28);
    p_Var1 = vkCreatePipelineCache;
    local_40._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
    pVVar2 = Fossilize::VulkanDevice::get_device(this->device);
    (*p_Var1)(pVVar2,(VkPipelineCacheCreateInfo *)local_40,(VkAllocationCallbacks *)0x0,
              &this->pipeline_cache);
  }
  return;
}

Assistant:

DisasmReplayer(VulkanDevice *device_)
		: device(device_)
	{
		if (device)
		{
			VkPipelineCacheCreateInfo info = { VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO };
			vkCreatePipelineCache(device->get_device(), &info, nullptr, &pipeline_cache);
		}
	}